

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

int __thiscall Clasp::DefaultUnfoundedCheck::init(DefaultUnfoundedCheck *this,EVP_PKEY_CTX *ctx)

{
  LitVec *pLVar1;
  bool bVar2;
  byte bVar3;
  ValueRep VVar4;
  UfsType UVar5;
  uint n_00;
  uint32 uVar6;
  size_type sVar7;
  LitVec *pLVar8;
  undefined7 extraout_var;
  ulong uVar9;
  reference pAVar10;
  undefined7 extraout_var_00;
  Solver *this_00;
  SolveParams *pSVar11;
  MinimalityCheck *pMVar12;
  AtomNode *this_01;
  BodyPtr BVar13;
  ValueRep v;
  AtomNode *a_1;
  size_type end_1;
  size_type i_2;
  uint32 sd;
  AtomNode *a;
  size_type end;
  size_type i_1;
  BodyPtr n;
  uint32 i;
  AtomData *sentinel;
  size_type startAtom;
  undefined4 in_stack_fffffffffffffe98;
  NodeId in_stack_fffffffffffffe9c;
  Solver *in_stack_fffffffffffffea0;
  DefaultUnfoundedCheck *in_stack_fffffffffffffea8;
  Solver *pSVar14;
  DefaultUnfoundedCheck *in_stack_fffffffffffffeb0;
  Solver *in_stack_fffffffffffffeb8;
  Solver *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffecc;
  DefaultUnfoundedCheck *in_stack_fffffffffffffed0;
  BodyPtr *n_01;
  undefined4 in_stack_fffffffffffffee0;
  size_type sVar15;
  undefined8 in_stack_fffffffffffffee8;
  ReasonStrategy rs;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_type local_ac;
  Antecedent local_90;
  uint32 local_84;
  AtomNode *local_80;
  size_type local_74;
  size_type local_70;
  uint32 local_6c;
  BodyNode *local_68;
  uint32 local_60;
  BodyNode *local_58;
  uint32 local_50;
  undefined1 local_44 [20];
  AtomData local_30;
  size_type local_2c;
  Antecedent local_28;
  uint32 local_1c;
  Solver *local_18;
  DefaultUnfoundedCheck *local_10;
  undefined1 local_1;
  
  rs = (ReasonStrategy)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  pLVar1 = this->reasons_;
  local_18 = (Solver *)ctx;
  local_10 = this;
  if (pLVar1 != (LitVec *)0x0) {
    for (pLVar8 = pLVar1 + *(long *)&pLVar1[-1].ebo_.size; pLVar1 != pLVar8; pLVar8 = pLVar8 + -1) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x20dfb7);
      rs = (ReasonStrategy)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    }
    operator_delete__(&pLVar1[-1].ebo_.size);
  }
  this->reasons_ = (LitVec *)0x0;
  this->solver_ = local_18;
  Solver::searchMode(local_18);
  setReasonStrategy((DefaultUnfoundedCheck *)
                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),rs);
  while (UVar5 = findUfs((DefaultUnfoundedCheck *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         in_stack_fffffffffffffec0,SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0)
                        ), UVar5 != ufs_none) {
    while (bVar2 = PodQueue<unsigned_int>::empty
                             ((PodQueue<unsigned_int> *)in_stack_fffffffffffffea0),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      PodQueue<unsigned_int>::front((PodQueue<unsigned_int> *)0x20e0a7);
      Asp::PrgDepGraph::getAtom((PrgDepGraph *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      local_1c = (uint32)Literal::operator~((Literal *)
                                            CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98));
      Antecedent::Antecedent(&local_28,(Constraint *)0x0);
      bVar2 = Solver::force(in_stack_fffffffffffffeb8,(Literal *)in_stack_fffffffffffffeb0,
                            (Antecedent *)in_stack_fffffffffffffea8);
      uVar9 = CONCAT71(extraout_var,bVar2) ^ 0xff;
      if ((uVar9 & 1) != 0) {
        local_1 = 0;
        goto LAB_0020e693;
      }
      n_00 = PodQueue<unsigned_int>::pop_ret((PodQueue<unsigned_int> *)0x20e11f);
      pAVar10 = bk_lib::
                pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                ::operator[](&this->atoms_,n_00);
      *pAVar10 = (AtomData)((uint)*pAVar10 & 0xbfffffff);
    }
  }
  local_2c = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
             ::size(&this->atoms_);
  Asp::PrgDepGraph::numAtoms((PrgDepGraph *)0x20e179);
  AtomData::AtomData(&local_30);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
  ::resize((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
            *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
           (AtomData *)in_stack_fffffffffffffec0);
  local_44._12_8_ =
       bk_lib::
       pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
       ::operator[](&this->atoms_,0);
  AtomData::resurrectSource((AtomData *)local_44._12_8_);
  *(uint *)local_44._12_8_ = (uint)*(AtomData *)local_44._12_8_ & 0xdfffffff | 0x20000000;
  *(uint *)local_44._12_8_ = (uint)*(AtomData *)local_44._12_8_ & 0xbfffffff | 0x40000000;
  local_44._8_4_ =
       bk_lib::
       pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
       ::size(&this->bodies_);
  while (sVar15 = local_44._8_4_, uVar6 = Asp::PrgDepGraph::numBodies((PrgDepGraph *)0x20e22c),
        sVar15 != uVar6) {
    in_stack_fffffffffffffed0 = (DefaultUnfoundedCheck *)&this->bodies_;
    n_01 = (BodyPtr *)local_44;
    BodyData::BodyData((BodyData *)n_01);
    bk_lib::
    pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
    ::push_back((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                 *)in_stack_fffffffffffffeb0,(BodyData *)in_stack_fffffffffffffea8);
    BVar13 = getBody((DefaultUnfoundedCheck *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    local_68 = BVar13.node;
    local_60 = BVar13.id;
    local_58 = local_68;
    local_50 = local_60;
    bVar2 = Asp::PrgDepGraph::BodyNode::extended(local_68);
    if (bVar2) {
      initExtBody((DefaultUnfoundedCheck *)CONCAT44(sVar15,in_stack_fffffffffffffee0),n_01);
    }
    else {
      initBody(in_stack_fffffffffffffeb0,(BodyPtr *)in_stack_fffffffffffffea8);
    }
    local_6c = (uint32)Literal::operator~((Literal *)
                                          CONCAT44(in_stack_fffffffffffffe9c,
                                                   in_stack_fffffffffffffe98));
    addWatch(in_stack_fffffffffffffea8,(Literal)(uint32)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
             (uint32)((ulong)in_stack_fffffffffffffea0 >> 0x20),(WatchType)in_stack_fffffffffffffea0
            );
    local_44._8_4_ = local_44._8_4_ + 1;
  }
  propagateSource(in_stack_fffffffffffffed0);
  local_70 = local_2c;
  local_74 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
             ::size(&this->atoms_);
  do {
    if (local_70 == local_74) {
      uVar6 = Asp::PrgDepGraph::numNonHcfs((PrgDepGraph *)0x20e4a2);
      uVar9 = (ulong)uVar6;
      if (uVar6 != 0) {
        this_00 = (Solver *)operator_new(0x18);
        pSVar11 = Solver::searchConfig(in_stack_fffffffffffffea0);
        MinimalityCheck::MinimalityCheck((MinimalityCheck *)this_00,&pSVar11->fwdCheck);
        SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::
        operator=((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                   *)in_stack_fffffffffffffea0,
                  (MinimalityCheck *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        pMVar12 = SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                  ::operator->((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                                *)0x20e50a);
        uVar9 = 0;
        if (((pMVar12->fwd).field_0x4 & 3) != 0) {
          local_ac = local_2c;
          sVar7 = bk_lib::
                  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                  ::size(&this->atoms_);
          for (; uVar9 = (ulong)local_ac, local_ac != sVar7; local_ac = local_ac + 1) {
            this_01 = Asp::PrgDepGraph::getAtom
                                ((PrgDepGraph *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
            ;
            bVar2 = Asp::PrgDepGraph::AtomNode::inDisjunctive(this_01);
            if (bVar2) {
              pSVar14 = this->solver_;
              Literal::var((Literal *)this_01);
              VVar4 = Solver::value(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
              if (VVar4 == '\0') {
                falseValue((Literal *)0x20e5da);
                in_stack_fffffffffffffea0 = this->solver_;
                Literal::var((Literal *)this_01);
                Solver::setPref(this_00,(Var)((ulong)pSVar14 >> 0x20),(Value)pSVar14,
                                (ValueRep)((ulong)in_stack_fffffffffffffea0 >> 0x38));
              }
            }
          }
        }
      }
      local_1 = 1;
LAB_0020e693:
      return (int)CONCAT71((int7)(uVar9 >> 8),local_1);
    }
    local_80 = Asp::PrgDepGraph::getAtom
                         ((PrgDepGraph *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    pAVar10 = bk_lib::
              pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
              ::operator[](&this->atoms_,local_70);
    bVar2 = AtomData::hasSource(pAVar10);
    uVar9 = 0;
    bVar3 = 0;
    if (!bVar2) {
      local_84 = (uint32)Literal::operator~((Literal *)
                                            CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98));
      Antecedent::Antecedent(&local_90,(Constraint *)0x0);
      bVar2 = Solver::force(in_stack_fffffffffffffeb8,(Literal *)in_stack_fffffffffffffeb0,
                            (Antecedent *)in_stack_fffffffffffffea8);
      uVar9 = CONCAT71(extraout_var_00,bVar2) ^ 0xff;
      bVar3 = (byte)uVar9;
    }
    uVar9 = uVar9 & 0xffffffffffffff00;
    if ((bVar3 & 1) != 0) {
      local_1 = 0;
      goto LAB_0020e693;
    }
    bVar2 = Asp::PrgDepGraph::AtomNode::inChoice(local_80);
    if (bVar2) {
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      addWatch(in_stack_fffffffffffffea8,(Literal)(uint32)((ulong)in_stack_fffffffffffffeb0 >> 0x20)
               ,(uint32)((ulong)in_stack_fffffffffffffea0 >> 0x20),
               (WatchType)in_stack_fffffffffffffea0);
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

bool DefaultUnfoundedCheck::init(Solver& s) {
	assert(!solver_ || solver_ == &s);
	delete[] reasons_;
	reasons_ = 0;
	solver_  = &s;
	setReasonStrategy(s.searchMode() != SolverStrategies::no_learning ? strategy_ : no_reason);
	// process any leftovers from previous steps
	while (findUfs(s, false) != ufs_none) {
		while (!ufs_.empty()) {
			if (!s.force(~graph_->getAtom(ufs_.front()).lit, 0)) { return false; }
			atoms_[ufs_.pop_ret()].ufs = 0;
		}
	}
	AtomVec::size_type startAtom = atoms_.size();
	// set up new atoms
	atoms_.resize(graph_->numAtoms());
	AtomData& sentinel = atoms_[DependencyGraph::sentinel_atom];
	sentinel.resurrectSource();
	sentinel.todo = 1;
	sentinel.ufs  = 1;
	// set up new bodies
	for (uint32 i = (uint32)bodies_.size(); i != graph_->numBodies(); ++i) {
		bodies_.push_back(BodyData());
		BodyPtr n(getBody(i));
		if (!n.node->extended()) {
			initBody(n);
		}
		else {
			initExtBody(n);
		}
		// when a body becomes false, it can no longer be used as source
		addWatch(~n.node->lit, n.id, watch_source_false);
	}
	// check for initially unfounded atoms
	propagateSource();
	for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
		const AtomNode& a = graph_->getAtom(NodeId(i));
		if (!atoms_[i].hasSource() && !solver_->force(~a.lit, 0)) {
			return false;
		}
		if (a.inChoice()) {
			addWatch(~a.lit, NodeId(i), watch_head_false);
		}
	}
	if (graph_->numNonHcfs() != 0) {
		mini_ = new MinimalityCheck(s.searchConfig().fwdCheck);
		if (const uint32 sd = mini_->fwd.signDef) {
			for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
				const AtomNode& a = graph_->getAtom(NodeId(i));
				if (a.inDisjunctive() && solver_->value(a.lit.var()) == value_free) {
					ValueRep v = falseValue(a.lit);
					if (sd == SolverStrategies::sign_pos || (sd == SolverStrategies::sign_rnd && (i & 1) != 0)) {
						v ^= static_cast<ValueRep>(3u);
					}
					solver_->setPref(a.lit.var(), ValueSet::def_value, v);
				}
			}
		}
	}
	return true;
}